

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::TiledRgbaInputFile::FromYa::FromYa(FromYa *this,TiledInputFile *inputFile)

{
  size_t in_RSI;
  Header *in_RDI;
  TiledInputFile *unaff_retaddr;
  long in_stack_00000008;
  Array2D<Imf_3_4::Rgba> *in_stack_00000010;
  TileDescription *td;
  Vec3<float> local_30 [2];
  TileDescription *local_18;
  size_t local_10;
  Header *header;
  
  local_10 = in_RSI;
  header = in_RDI;
  std::mutex::mutex((mutex *)0x24cadd);
  (in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = local_10;
  Imath_3_2::Vec3<float>::Vec3((Vec3<float> *)(in_RDI + 1));
  Array2D<Imf_3_4::Rgba>::Array2D
            ((Array2D<Imf_3_4::Rgba> *)
             &in_RDI[1]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  TiledInputFile::header(unaff_retaddr);
  local_18 = Header::tileDescription((Header *)0x24cb22);
  *(uint *)&in_RDI->_readsNothing = local_18->xSize;
  *(uint *)&in_RDI->field_0x34 = local_18->ySize;
  TiledInputFile::header(unaff_retaddr);
  anon_unknown_23::ywFromHeader(header);
  Imath_3_2::Vec3<float>::operator=((Vec3<float> *)(in_RDI + 1),local_30);
  Array2D<Imf_3_4::Rgba>::resizeErase(in_stack_00000010,in_stack_00000008,(long)unaff_retaddr);
  in_RDI[1]._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&in_RDI[1]._readsNothing = 0;
  *(undefined8 *)&in_RDI[2]._map._M_t._M_impl = 0;
  return;
}

Assistant:

TiledRgbaInputFile::FromYa::FromYa (TiledInputFile& inputFile)
    : _inputFile (inputFile)
{
    const TileDescription& td = inputFile.header ().tileDescription ();

    _tileXSize = td.xSize;
    _tileYSize = td.ySize;
    _yw        = ywFromHeader (_inputFile.header ());
    _buf.resizeErase (_tileYSize, _tileXSize);
    _fbBase    = 0;
    _fbXStride = 0;
    _fbYStride = 0;
}